

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol(DescriptorPool *this,string *symbol_name)

{
  bool bVar1;
  Tables *pTVar2;
  Symbol SVar3;
  undefined4 uStack_5c;
  FileDescriptor *file_result;
  undefined1 auStack_38 [8];
  Symbol result;
  MutexLockMaybe lock;
  string *symbol_name_local;
  DescriptorPool *this_local;
  
  internal::MutexLockMaybe::MutexLockMaybe((MutexLockMaybe *)&result.field_1,this->mutex_);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  SVar3 = Tables::FindSymbol(pTVar2,symbol_name);
  result._0_8_ = SVar3.field_1;
  auStack_38._0_4_ = SVar3.type;
  bVar1 = anon_unknown_1::Symbol::IsNull((Symbol *)auStack_38);
  if (bVar1) {
    if ((this->underlay_ == (DescriptorPool *)0x0) ||
       (this_local = (DescriptorPool *)FindFileContainingSymbol(this->underlay_,symbol_name),
       this_local == (DescriptorPool *)0x0)) {
      bVar1 = TryFindSymbolInFallbackDatabase(this,symbol_name);
      if (bVar1) {
        pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                           (&this->tables_);
        SVar3 = Tables::FindSymbol(pTVar2,symbol_name);
        result._0_8_ = SVar3.field_1;
        auStack_38._4_4_ = uStack_5c;
        auStack_38._0_4_ = SVar3.type;
        bVar1 = anon_unknown_1::Symbol::IsNull((Symbol *)auStack_38);
        if (!bVar1) {
          this_local = (DescriptorPool *)anon_unknown_1::Symbol::GetFile((Symbol *)auStack_38);
          goto LAB_002b8e6e;
        }
      }
      this_local = (DescriptorPool *)0x0;
    }
  }
  else {
    this_local = (DescriptorPool *)anon_unknown_1::Symbol::GetFile((Symbol *)auStack_38);
  }
LAB_002b8e6e:
  internal::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)&result.field_1);
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    const string& symbol_name) const {
  MutexLockMaybe lock(mutex_);
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != NULL) {
    const FileDescriptor* file_result =
      underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != NULL) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return NULL;
}